

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O1

_Bool mpack_expect_bool(mpack_reader_t *reader)

{
  _Bool _Var1;
  byte bVar2;
  
  bVar2 = 0;
  if (reader->error == mpack_ok) {
    if (reader->end == reader->data) {
      _Var1 = mpack_reader_ensure_straddle(reader,1);
      bVar2 = 0;
      if (!_Var1) goto LAB_001081d8;
    }
    bVar2 = *reader->data;
    reader->data = reader->data + 1;
  }
LAB_001081d8:
  if (((bVar2 & 0xfe) != 0xc2) && (reader->error == mpack_ok)) {
    reader->error = mpack_error_type;
    reader->end = reader->data;
    if (reader->error_fn != (mpack_reader_error_t)0x0) {
      (*reader->error_fn)(reader,mpack_error_type);
    }
  }
  return (_Bool)(bVar2 & 1);
}

Assistant:

bool mpack_expect_bool(mpack_reader_t* reader) {
    uint8_t type = mpack_expect_type_byte(reader);
    if ((type & ~1) != 0xc2)
        mpack_reader_flag_error(reader, mpack_error_type);
    return (bool)(type & 1);
}